

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O3

int SetBaseCfgublox(UBLOX *publox)

{
  double dVar1;
  int i_16;
  ssize_t sVar2;
  uchar CK_B;
  int iVar3;
  int i;
  long lVar4;
  uchar CK_A;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uchar sendbuf [512];
  char local_298 [18];
  undefined4 uStack_286;
  undefined1 uStack_282;
  undefined1 uStack_281;
  byte bStack_280;
  undefined1 uStack_27f;
  undefined1 uStack_27e;
  undefined1 uStack_27d;
  undefined2 uStack_27c;
  undefined2 uStack_27a;
  undefined2 uStack_278;
  undefined4 local_276;
  undefined2 local_272;
  undefined4 uStack_270;
  undefined2 uStack_26c;
  char local_26a;
  char local_269;
  undefined8 local_218;
  undefined4 local_210;
  undefined2 local_20c;
  char local_20a;
  char local_209;
  undefined8 local_208;
  undefined4 local_200;
  undefined2 local_1fc;
  char local_1fa;
  char local_1f9;
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined2 local_1ec;
  char local_1ea;
  char local_1e9;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined2 local_1dc;
  char local_1da;
  char local_1d9;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined2 local_1cc;
  char local_1ca;
  char local_1c9;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined2 local_1bc;
  char local_1ba;
  char local_1b9;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined2 local_1ac;
  char local_1aa;
  char local_1a9;
  undefined8 local_1a8;
  undefined4 local_1a0;
  undefined2 local_19c;
  char local_19a;
  char local_199;
  undefined8 local_198;
  undefined4 local_190;
  undefined2 local_18c;
  char local_18a;
  char local_189;
  undefined8 local_188;
  undefined4 local_180;
  undefined2 local_17c;
  char local_17a;
  char local_179;
  undefined8 local_178;
  undefined4 local_170;
  undefined2 local_16c;
  char local_16a;
  char local_169;
  undefined8 local_168;
  undefined4 local_160;
  undefined2 local_15c;
  char local_15a;
  char local_159;
  undefined8 local_158;
  undefined4 local_150;
  undefined2 local_14c;
  char local_14a;
  char local_149;
  undefined8 local_148;
  undefined4 local_140;
  undefined2 local_13c;
  char local_13a;
  char local_139;
  undefined8 local_138;
  undefined4 local_130;
  undefined2 local_12c;
  char local_12a;
  char local_129;
  undefined8 local_128;
  undefined4 local_120;
  undefined2 local_11c;
  char local_11a;
  char local_119;
  undefined8 local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 local_104;
  undefined2 local_100;
  char local_fe;
  char local_fd;
  undefined8 local_fc;
  ulong uStack_f4;
  undefined8 local_ec;
  undefined8 uStack_e4;
  ulong local_dc;
  undefined4 local_d4;
  undefined2 local_d0;
  char local_ce;
  char local_cd;
  
  local_298[5] = 0;
  local_298[6] = 0xf5;
  local_298[7] = 5;
  local_298[8] = 0;
  local_298[9] = 1;
  local_298[10] = 0;
  local_298[0xb] = 1;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  lVar4 = 2;
  local_209 = '\0';
  local_20a = '\0';
  do {
    local_20a = local_20a + local_298[lVar4];
    local_209 = local_209 + local_20a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_20a;
  local_298[0xf] = local_209;
  local_218 = 0x5f50008010662b5;
  local_210 = 0x1000100;
  local_20c = 0;
  local_298[5] = 0;
  local_298[6] = 0xf5;
  local_298[7] = 0x4d;
  local_298[8] = 0;
  local_298[9] = 1;
  local_298[10] = 0;
  local_298[0xb] = 1;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  lVar4 = 2;
  local_1f9 = '\0';
  local_1fa = '\0';
  do {
    local_1fa = local_1fa + local_298[lVar4];
    local_1f9 = local_1f9 + local_1fa;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_1fa;
  local_298[0xf] = local_1f9;
  local_208 = 0x4df50008010662b5;
  local_200 = 0x1000100;
  local_1fc = 0;
  local_298[5] = 0;
  local_298[6] = 0xf5;
  local_298[7] = 0x57;
  local_298[8] = 0;
  local_298[9] = 1;
  local_298[10] = 0;
  local_298[0xb] = 1;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  lVar4 = 2;
  local_1e9 = '\0';
  local_1ea = '\0';
  do {
    local_1ea = local_1ea + local_298[lVar4];
    local_1e9 = local_1e9 + local_1ea;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_1ea;
  local_298[0xf] = local_1e9;
  local_1f8 = 0x57f50008010662b5;
  local_1f0 = 0x1000100;
  local_1ec = 0;
  local_298[5] = 0;
  local_298[6] = 0xf5;
  local_298[7] = 0x61;
  local_298[8] = 0;
  local_298[9] = 1;
  local_298[10] = 0;
  local_298[0xb] = 1;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  lVar4 = 2;
  local_1d9 = '\0';
  local_1da = '\0';
  do {
    local_1da = local_1da + local_298[lVar4];
    local_1d9 = local_1d9 + local_1da;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_1da;
  local_298[0xf] = local_1d9;
  local_1e8 = 0x61f50008010662b5;
  local_1e0 = 0x1000100;
  local_1dc = 0;
  local_298[5] = 0;
  local_298[6] = 0xf5;
  local_298[7] = 0x7f;
  local_298[8] = 0;
  local_298[9] = 1;
  local_298[10] = 0;
  local_298[0xb] = 1;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  lVar4 = 2;
  local_1c9 = '\0';
  local_1ca = '\0';
  do {
    local_1ca = local_1ca + local_298[lVar4];
    local_1c9 = local_1c9 + local_1ca;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_1ca;
  local_298[0xf] = local_1c9;
  local_1d8 = 0x7ff50008010662b5;
  local_1d0 = 0x1000100;
  local_1cc = 0;
  local_298[5] = 0;
  local_298[6] = 0xf5;
  local_298[7] = 0xe6;
  local_298[8] = 0;
  local_298[9] = 1;
  local_298[10] = 0;
  local_298[0xb] = 1;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  lVar4 = 2;
  local_1b9 = '\0';
  local_1ba = '\0';
  do {
    local_1ba = local_1ba + local_298[lVar4];
    local_1b9 = local_1b9 + local_1ba;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_1ba;
  local_298[0xf] = local_1b9;
  local_1c8 = 0xe6f50008010662b5;
  local_1c0 = 0x1000100;
  local_1bc = 0;
  local_298[5] = 0;
  local_298[6] = 0xf5;
  local_298[7] = 0xfe;
  local_298[8] = 0;
  local_298[9] = 1;
  local_298[10] = 0;
  local_298[0xb] = 1;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  lVar4 = 2;
  local_1a9 = '\0';
  local_1aa = '\0';
  do {
    local_1aa = local_1aa + local_298[lVar4];
    local_1a9 = local_1a9 + local_1aa;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_1aa;
  local_298[0xf] = local_1a9;
  local_1b8 = 0xfef50008010662b5;
  local_1b0 = 0x1000100;
  local_1ac = 0;
  local_298[5] = 0;
  local_298[6] = 0xf0;
  local_199 = '\0';
  local_298[0xb] = 0;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[7] = 0;
  local_298[8] = 0;
  local_298[9] = 0;
  local_298[10] = 0;
  lVar4 = 2;
  local_19a = '\0';
  do {
    local_19a = local_19a + local_298[lVar4];
    local_199 = local_199 + local_19a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_19a;
  local_298[0xf] = local_199;
  local_1a8 = 0xf00008010662b5;
  local_1a0 = 0;
  local_19c = 0;
  local_298[5] = 0;
  local_298[6] = 0xf0;
  local_298[7] = 1;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[8] = 0;
  local_298[9] = 0;
  local_298[10] = 0;
  local_298[0xb] = 0;
  lVar4 = 2;
  local_189 = '\0';
  local_18a = '\0';
  do {
    local_18a = local_18a + local_298[lVar4];
    local_189 = local_189 + local_18a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_18a;
  local_298[0xf] = local_189;
  local_198 = 0x1f00008010662b5;
  local_190 = 0;
  local_18c = 0;
  local_298[5] = 0;
  local_298[6] = 0xf0;
  local_298[7] = 2;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[8] = 0;
  local_298[9] = 0;
  local_298[10] = 0;
  local_298[0xb] = 0;
  lVar4 = 2;
  local_179 = '\0';
  local_17a = '\0';
  do {
    local_17a = local_17a + local_298[lVar4];
    local_179 = local_179 + local_17a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_17a;
  local_298[0xf] = local_179;
  local_188 = 0x2f00008010662b5;
  local_180 = 0;
  local_17c = 0;
  local_298[5] = 0;
  local_298[6] = 0xf0;
  local_298[7] = 3;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[8] = 0;
  local_298[9] = 0;
  local_298[10] = 0;
  local_298[0xb] = 0;
  lVar4 = 2;
  local_169 = '\0';
  local_16a = '\0';
  do {
    local_16a = local_16a + local_298[lVar4];
    local_169 = local_169 + local_16a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_16a;
  local_298[0xf] = local_169;
  local_178 = 0x3f00008010662b5;
  local_170 = 0;
  local_16c = 0;
  local_298[5] = 0;
  local_298[6] = 0xf0;
  local_298[7] = 4;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[8] = 0;
  local_298[9] = 0;
  local_298[10] = 0;
  local_298[0xb] = 0;
  lVar4 = 2;
  local_159 = '\0';
  local_15a = '\0';
  do {
    local_15a = local_15a + local_298[lVar4];
    local_159 = local_159 + local_15a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_15a;
  local_298[0xf] = local_159;
  local_168 = 0x4f00008010662b5;
  local_160 = 0;
  local_15c = 0;
  local_298[5] = 0;
  local_298[6] = 0xf0;
  local_298[7] = 5;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[8] = 0;
  local_298[9] = 0;
  local_298[10] = 0;
  local_298[0xb] = 0;
  lVar4 = 2;
  local_149 = '\0';
  local_14a = '\0';
  do {
    local_14a = local_14a + local_298[lVar4];
    local_149 = local_149 + local_14a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_14a;
  local_298[0xf] = local_149;
  local_158 = 0x5f00008010662b5;
  local_150 = 0;
  local_14c = 0;
  local_298[5] = 0;
  local_298[6] = 0xf0;
  local_298[7] = 7;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[8] = 0;
  local_298[9] = 0;
  local_298[10] = 0;
  local_298[0xb] = 0;
  lVar4 = 2;
  local_139 = '\0';
  local_13a = '\0';
  do {
    local_13a = local_13a + local_298[lVar4];
    local_139 = local_139 + local_13a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_13a;
  local_298[0xf] = local_139;
  local_148 = 0x7f00008010662b5;
  local_140 = 0;
  local_13c = 0;
  local_298[5] = 0;
  local_298[6] = 0xf0;
  local_298[7] = 8;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[8] = 0;
  local_298[9] = 0;
  local_298[10] = 0;
  local_298[0xb] = 0;
  lVar4 = 2;
  local_129 = '\0';
  local_12a = '\0';
  do {
    local_12a = local_12a + local_298[lVar4];
    local_129 = local_129 + local_12a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_298[0xe] = local_12a;
  local_298[0xf] = local_129;
  local_138 = 0x8f00008010662b5;
  local_130 = 0;
  local_12c = 0;
  local_298[5] = 0;
  local_298[6] = 0xf0;
  local_298[7] = 0xd;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[8] = 0;
  local_298[9] = 0;
  local_298[10] = 0;
  local_298[0xb] = 0;
  lVar4 = 2;
  local_119 = '\0';
  local_11a = '\0';
  do {
    local_11a = local_11a + local_298[lVar4];
    local_119 = local_119 + local_11a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xe);
  local_128 = 0xdf00008010662b5;
  local_120 = 0;
  local_11c = 0;
  local_fd = '\0';
  local_298[0xe] = 0;
  local_298[0xf] = 0;
  local_298[0x10] = 0;
  local_298[10] = 0;
  local_298[0xb] = 0;
  local_298[0xc] = 0;
  local_298[0xd] = 0;
  local_298[0] = -0x4b;
  local_298[5] = 0;
  local_298[6] = 0;
  local_298[7] = 0x23;
  local_298[8] = 0;
  local_298[9] = 10;
  local_298[0x11] = 1;
  uStack_286._0_2_ = 0;
  uStack_286._2_2_ = 0;
  uStack_282 = 0;
  uStack_281 = 0;
  bStack_280 = 0;
  uStack_27f = 0;
  lVar4 = 2;
  local_fe = '\0';
  do {
    local_fe = local_fe + local_298[lVar4];
    local_fd = local_fd + local_fe;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1a);
  local_118 = 0x23000014170662b5;
  uStack_110 = 0xa00;
  uStack_10c = 0;
  uStack_108 = 0x100;
  local_104 = 0;
  local_100 = 0;
  local_298[8] = (char)publox->SurveyMode;
  dVar1 = publox->fixedAlt * 100.0;
  iVar3 = (int)dVar1;
  lVar4 = (long)(publox->fixedPosAcc * 10000.0);
  builtin_strncpy(local_298 + 1,"b\x06q(",5);
  local_269 = '\0';
  local_298[6] = 0;
  local_298[7] = 0;
  local_298[9] = 1;
  iVar7 = (int)(publox->fixedLat * 10000000.0);
  iVar8 = (int)(publox->fixedLon * 10000000.0);
  local_298[10] = (char)iVar7;
  local_298[0xb] = (char)((uint)iVar7 >> 8);
  local_298[0xc] = (char)((uint)iVar7 >> 0x10);
  local_298[0xd] = (char)((uint)iVar7 >> 0x18);
  local_298[0xe] = (char)iVar8;
  local_298[0xf] = (char)((uint)iVar8 >> 8);
  local_298[0x10] = (char)((uint)iVar8 >> 0x10);
  local_298[0x11] = (char)((uint)iVar8 >> 0x18);
  uStack_286._0_2_ = (undefined2)iVar3;
  uStack_286._2_2_ = (undefined2)((uint)iVar3 >> 0x10);
  uStack_282 = (undefined1)(int)((publox->fixedLat * 10000000.0 - (double)iVar7) * 100.0);
  uStack_281 = (undefined1)(int)((publox->fixedLon * 10000000.0 - (double)iVar8) * 100.0);
  bStack_280 = (byte)(int)((dVar1 - (double)(int)dVar1) * 100.0);
  uStack_27f = 0;
  uStack_27e = (undefined1)lVar4;
  uStack_27d = (undefined1)((ulong)lVar4 >> 8);
  uStack_27c = (undefined2)((ulong)lVar4 >> 0x10);
  uStack_27a = (undefined2)(long)publox->svinMinDur;
  uStack_278 = (undefined2)((ulong)(long)publox->svinMinDur >> 0x10);
  local_276 = (undefined4)(long)(publox->svinAccLimit * 10000.0);
  local_272 = 0;
  uStack_270 = 0;
  uStack_26c = 0;
  lVar4 = 2;
  local_26a = '\0';
  do {
    local_26a = local_26a + local_298[lVar4];
    local_269 = local_269 + local_26a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x2e);
  local_fc = 0x28710662b5;
  uStack_f4 = CONCAT17(local_298[0xf],
                       CONCAT16(local_298[0xe],
                                CONCAT15(local_298[0xd],
                                         CONCAT14(local_298[0xc],
                                                  CONCAT13(local_298[0xb],
                                                           CONCAT12(local_298[10],
                                                                    (ushort)(byte)local_298[8]))))))
              | 0x100;
  local_ec = CONCAT17(uStack_281,
                      CONCAT16(uStack_282,
                               CONCAT24(uStack_286._2_2_,
                                        CONCAT22((undefined2)uStack_286,(short)((uint)iVar8 >> 0x10)
                                                ))));
  uStack_e4 = CONCAT26(uStack_27a,
                       CONCAT24(uStack_27c,
                                CONCAT13(uStack_27d,CONCAT12(uStack_27e,(ushort)bStack_280))));
  local_dc = (ulong)CONCAT42(local_276,uStack_278);
  local_d4 = 0;
  local_d0 = 0;
  iVar7 = (publox->RS232Port).DevType;
  local_ce = local_26a;
  local_cd = local_269;
  uStack_286 = iVar3;
  if (iVar7 - 1U < 4) {
    iVar3 = (publox->RS232Port).s;
    uVar6 = 0;
    do {
      sVar2 = send(iVar3,(void *)((long)&local_218 + uVar6),(ulong)(0x14c - (int)uVar6),0);
      if ((int)sVar2 < 1) goto LAB_0012b504;
      uVar5 = (int)uVar6 + (int)sVar2;
      uVar6 = (ulong)uVar5;
    } while ((int)uVar5 < 0x14c);
  }
  else {
    if (iVar7 != 0) {
LAB_0012b504:
      puts("Error writing data to a ublox. ");
      return 1;
    }
    iVar3 = *(int *)&(publox->RS232Port).hDev;
    uVar6 = 0;
    do {
      sVar2 = write(iVar3,(void *)((long)&local_218 + uVar6),(ulong)(0x14c - (int)uVar6));
      if ((int)sVar2 < 1) goto LAB_0012b504;
      uVar5 = (int)uVar6 + (int)sVar2;
      uVar6 = (ulong)uVar5;
    } while (uVar5 < 0x14c);
  }
  if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
    fwrite(&local_218,0x14c,1,(FILE *)publox->pfSaveFile);
    fflush((FILE *)publox->pfSaveFile);
  }
  return 0;
}

Assistant:

inline int SetBaseCfgublox(UBLOX* publox)
{
	unsigned char sendbuf[512];
	int sendbuflen = 0;
	int offset = 0;
	unsigned char packet[128];
	int packetlen = 0;
	unsigned char cfg_msg_pl[8];
	struct CFG_NMEA_PL_UBX cfg_nmea_pl;
	struct CFG_TMODE3_PL_UBX cfg_tmode3_pl;

	// Enable 1005, 1077, 1087, 1127 RTCM messages on UART1 and USB.
	memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	cfg_msg_pl[0] = RTCM_CLASS_UBX;
	cfg_msg_pl[1] = RTCM_1005_ID_UBX;
	cfg_msg_pl[3] = 1; // UART1 rate.
	cfg_msg_pl[5] = 1; // USB rate.
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1077_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1087_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1097_ID_UBX; // Not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1127_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1230_ID_UBX; // Not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_4072_0_ID_UBX; // For moving base, not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	// Disable GGA, GLL, GSA, GSV, RMC, VTG, GST, ZDA, GNS NMEA messages.
	memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	cfg_msg_pl[0] = NMEA_STD_CLASS_UBX;
	cfg_msg_pl[1] = NMEA_STD_GGA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GLL_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GSA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GSV_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_RMC_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_VTG_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GST_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_ZDA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GNS_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	//cfg_msg_pl[1] = NMEA_STD_TXT_ID_UBX;
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	////EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	//memcpy(sendbuf+offset, packet, packetlen);
	//offset += packetlen;

	// Set NMEA high precision mode.
	memset(&cfg_nmea_pl, 0, sizeof(cfg_nmea_pl));
	cfg_nmea_pl.nmeaVersion = NMEA_VERSION_2_3_UBX;
	cfg_nmea_pl.flags.consider = 1;
	cfg_nmea_pl.flags.highPrec = 1;
	cfg_nmea_pl.version = 1;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, LEN_CFG_NMEA_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, sizeof(cfg_nmea_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;

	//UBX-CFG-PORT set RTCM 3 as Output Protocol...

	// Activate Self-Survey-In or Fixed-Position-Mode.
	memset(&cfg_tmode3_pl, 0, sizeof(cfg_tmode3_pl));
	cfg_tmode3_pl.flags.lla = 1;
	cfg_tmode3_pl.flags.mode = (unsigned short)publox->SurveyMode;
	cfg_tmode3_pl.ecefXOrLat = (int)(publox->fixedLat*10000000);
	cfg_tmode3_pl.ecefYOrLon = (int)(publox->fixedLon*10000000);
	cfg_tmode3_pl.ecefZOrAlt = (int)(publox->fixedAlt*100);
	cfg_tmode3_pl.ecefXOrLatHP = (char)((publox->fixedLat*10000000-cfg_tmode3_pl.ecefXOrLat)*100);
	cfg_tmode3_pl.ecefYOrLonHP = (char)((publox->fixedLon*10000000-cfg_tmode3_pl.ecefYOrLon)*100);
	cfg_tmode3_pl.ecefZOrAltHP = (char)((publox->fixedAlt*100-cfg_tmode3_pl.ecefZOrAlt)*100);
	cfg_tmode3_pl.fixedPosAcc = (unsigned int)(publox->fixedPosAcc*10000);
	cfg_tmode3_pl.svinMinDur = (unsigned int)publox->svinMinDur;
	cfg_tmode3_pl.svinAccLimit = (unsigned int)(publox->svinAccLimit*10000);
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_TMODE3_ID_UBX, (unsigned char*)&cfg_tmode3_pl, LEN_CFG_TMODE3_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_TMODE3_ID_UBX, (unsigned char*)&cfg_tmode3_pl, sizeof(cfg_tmode3_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	
	sendbuflen = offset;

	if (WriteAllRS232Port(&publox->RS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	// Should check ACK...

	return EXIT_SUCCESS;
}